

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O2

void __thiscall
Indexing::CodeTree::Compiler<false>::handleVar
          (Compiler<false> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  bool bVar1;
  uint uVar2;
  CodeOp elem;
  long lStack_20;
  uint *varNumPtr;
  
  bVar1 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (&this->varMap,var,&varNumPtr);
  if (bVar1) {
    uVar2 = this->nextVarNum;
    this->nextVarNum = uVar2 + 1;
    *varNumPtr = uVar2;
    lStack_20 = 4;
  }
  else {
    uVar2 = *varNumPtr;
    lStack_20 = 5;
  }
  elem._alternative = (CodeOp *)0x0;
  elem._content = lStack_20 + (ulong)uVar2 * 8;
  Lib::Stack<Indexing::CodeTree::CodeOp>::push(this->code,elem);
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}